

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ESOINN.cpp
# Opt level: O0

VertexProperties * __thiscall
soinn::ESOINN::getBestMatch
          (VertexProperties *__return_storage_ptr__,ESOINN *this,
          vector<double,_boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>_>
          *inputSignal)

{
  bool bVar1;
  reference ppvVar2;
  vertex_bundled *pvVar3;
  _List_node_base *p_Var4;
  double dist;
  pair<std::_List_iterator<void_*>,_std::_List_iterator<void_*>_> local_50;
  _List_iterator<void_*> local_40;
  VertexIterator end;
  VertexIterator current;
  double firstWinnerDistance;
  Vertex firstWinner;
  vector<double,_boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>_>
  *inputSignal_local;
  ESOINN *this_local;
  
  firstWinnerDistance = 0.0;
  current._M_node = (_List_node_base *)std::numeric_limits<double>::max();
  std::_List_iterator<void_*>::_List_iterator(&end);
  std::_List_iterator<void_*>::_List_iterator(&local_40);
  local_50 = boost::
             vertices<boost::detail::adj_list_gen<boost::adjacency_list<boost::listS,boost::listS,boost::undirectedS,boost::property<boost::vertex_index_t,unsigned_long,soinn::VertexProperties>,soinn::EdgeProperties,boost::no_property,boost::listS>,boost::listS,boost::listS,boost::undirectedS,boost::property<boost::vertex_index_t,unsigned_long,soinn::VertexProperties>,soinn::EdgeProperties,boost::no_property,boost::listS>::config,boost::undirected_graph_helper<boost::detail::adj_list_gen<boost::adjacency_list<boost::listS,boost::listS,boost::undirectedS,boost::property<boost::vertex_index_t,unsigned_long,soinn::VertexProperties>,soinn::EdgeProperties,boost::no_property,boost::listS>,boost::listS,boost::listS,boost::undirectedS,boost::property<boost::vertex_index_t,unsigned_long,soinn::VertexProperties>,soinn::EdgeProperties,boost::no_property,boost::listS>::config>>
                       ((adj_list_helper<boost::detail::adj_list_gen<boost::adjacency_list<boost::listS,_boost::listS,_boost::undirectedS,_boost::property<boost::vertex_index_t,_unsigned_long,_soinn::VertexProperties>,_soinn::EdgeProperties,_boost::no_property,_boost::listS>,_boost::listS,_boost::listS,_boost::undirectedS,_boost::property<boost::vertex_index_t,_unsigned_long,_soinn::VertexProperties>,_soinn::EdgeProperties,_boost::no_property,_boost::listS>::config,_boost::undirected_graph_helper<boost::detail::adj_list_gen<boost::adjacency_list<boost::listS,_boost::listS,_boost::undirectedS,_boost::property<boost::vertex_index_t,_unsigned_long,_soinn::VertexProperties>,_soinn::EdgeProperties,_boost::no_property,_boost::listS>,_boost::listS,_boost::listS,_boost::undirectedS,_boost::property<boost::vertex_index_t,_unsigned_long,_soinn::VertexProperties>,_soinn::EdgeProperties,_boost::no_property,_boost::listS>::config>_>
                         *)&this->graph);
  boost::tuples::tie<std::_List_iterator<void*>,std::_List_iterator<void*>>
            ((tuples *)&dist,&end,&local_40);
  boost::tuples::
  tuple<std::_List_iterator<void*>&,std::_List_iterator<void*>&,boost::tuples::null_type,boost::tuples::null_type,boost::tuples::null_type,boost::tuples::null_type,boost::tuples::null_type,boost::tuples::null_type,boost::tuples::null_type,boost::tuples::null_type>
  ::operator=((tuple<std::_List_iterator<void*>&,std::_List_iterator<void*>&,boost::tuples::null_type,boost::tuples::null_type,boost::tuples::null_type,boost::tuples::null_type,boost::tuples::null_type,boost::tuples::null_type,boost::tuples::null_type,boost::tuples::null_type>
               *)&dist,&local_50);
  while( true ) {
    bVar1 = std::operator!=(&end,&local_40);
    if (!bVar1) break;
    ppvVar2 = std::_List_iterator<void_*>::operator*(&end);
    pvVar3 = boost::
             adjacency_list<boost::listS,_boost::listS,_boost::undirectedS,_boost::property<boost::vertex_index_t,_unsigned_long,_soinn::VertexProperties>,_soinn::EdgeProperties,_boost::no_property,_boost::listS>
             ::operator[](&this->graph,*ppvVar2);
    p_Var4 = (_List_node_base *)distance(this,inputSignal,&pvVar3->weight);
    if ((double)p_Var4 < (double)current._M_node) {
      ppvVar2 = std::_List_iterator<void_*>::operator*(&end);
      firstWinnerDistance = (double)*ppvVar2;
      current._M_node = p_Var4;
    }
    std::_List_iterator<void_*>::operator++(&end,0);
  }
  pvVar3 = boost::
           adjacency_list<boost::listS,_boost::listS,_boost::undirectedS,_boost::property<boost::vertex_index_t,_unsigned_long,_soinn::VertexProperties>,_soinn::EdgeProperties,_boost::no_property,_boost::listS>
           ::operator[](&this->graph,(vertex_descriptor)firstWinnerDistance);
  VertexProperties::VertexProperties(__return_storage_ptr__,pvVar3);
  return __return_storage_ptr__;
}

Assistant:

VertexProperties ESOINN::getBestMatch(boost::numeric::ublas::vector<double>& inputSignal)
{
    Vertex firstWinner = NULL;
    double firstWinnerDistance = std::numeric_limits<double>::max();
    VertexIterator current, end;
    boost::tie(current, end) = boost::vertices(graph);
    for(; current != end; current++)
    {
        double dist = distance(inputSignal, graph[*current].weight);
        if(dist < firstWinnerDistance)
        {
            firstWinner = *current;
            firstWinnerDistance = dist;
        }
    }
    return graph[firstWinner];
}